

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O2

unique_ptr<spvtools::opt::analysis::FloatConstant,_std::default_delete<spvtools::opt::analysis::FloatConstant>_>
 __thiscall spvtools::opt::analysis::FloatConstant::CopyFloatConstant(FloatConstant *this)

{
  long in_RSI;
  Float *local_18;
  
  local_18 = (Float *)(**(code **)(**(long **)(in_RSI + 8) + 0x60))();
  MakeUnique<spvtools::opt::analysis::FloatConstant,spvtools::opt::analysis::Float_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>const&>
            ((spvtools *)this,&local_18,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RSI + 0x10));
  return (__uniq_ptr_data<spvtools::opt::analysis::FloatConstant,_std::default_delete<spvtools::opt::analysis::FloatConstant>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::analysis::FloatConstant,_std::default_delete<spvtools::opt::analysis::FloatConstant>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<FloatConstant> CopyFloatConstant() const {
    return MakeUnique<FloatConstant>(type_->AsFloat(), words_);
  }